

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O1

int Gia_ManBmcPerformInt(Gia_Man_t *pGia,Bmc_AndPar_t *pPars)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  sat_solver *psVar6;
  Gia_Obj_t *pGVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  Bmc_Mna_t *p;
  Gia_Man_t *pGVar15;
  Gia_Man_t *pGVar16;
  Aig_Man_t *pAig;
  Cnf_Dat_t *pCVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Abc_Cex_t *pAVar18;
  int extraout_EDX;
  int extraout_EDX_00;
  long lVar19;
  long lVar20;
  abctime aVar21;
  uint uVar22;
  Gia_Obj_t *pGVar23;
  ulong uVar24;
  double dVar25;
  uint local_84;
  int Lit;
  timespec ts;
  
  Lit = 1;
  iVar9 = clock_gettime(3,(timespec *)&ts);
  if (iVar9 < 0) {
    lVar19 = 1;
  }
  else {
    lVar19 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar19 = ((lVar19 >> 7) - (lVar19 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  p = Bmc_MnaAlloc();
  psVar6 = p->pSat;
  iVar9 = pPars->nTimeOut;
  if ((long)iVar9 == 0) {
    aVar21 = 0;
  }
  else {
    iVar10 = clock_gettime(3,(timespec *)&ts);
    if (iVar10 < 0) {
      lVar20 = -1;
    }
    else {
      lVar20 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    aVar21 = lVar20 + (long)iVar9 * 1000000;
  }
  psVar6->nRuntimeLimit = aVar21;
  pGVar15 = Gia_ManBmcUnroll(pGia,pPars->nFramesMax,pPars->nFramesAdd,pPars->fVeryVerbose,&p->vPiMap
                            );
  p->pFrames = pGVar15;
  uVar11 = (pGVar15->vCos->nSize - pGVar15->nRegs) / (pGia->vCos->nSize - pGia->nRegs);
  if (pPars->fVerbose != 0) {
    uVar12 = Gia_ManBmcFindFirst(pGVar15);
    printf("Unfolding for %d frames with first non-trivial PO %d.  ",(ulong)uVar11,(ulong)uVar12);
    iVar10 = 3;
    iVar9 = clock_gettime(3,(timespec *)&ts);
    if (iVar9 < 0) {
      lVar20 = -1;
    }
    else {
      lVar20 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    Abc_Print(iVar10,"%s =","Time");
    Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar20 + lVar19) / 1000000.0);
  }
  if (pPars->fUseSynth == 0) {
    if (pPars->fVerbose != 0) {
      Gia_ManPrintStats(p->pFrames,(Gps_Par_t *)0x0);
    }
  }
  else {
    pGVar15 = p->pFrames;
    pGVar16 = Gia_ManAigSyn2(pGVar15,1,0,0,0,0,pPars->fVerbose,0);
    p->pFrames = pGVar16;
    Gia_ManStop(pGVar15);
  }
  if (pPars->fDumpFrames != 0) {
    Gia_AigerWrite(p->pFrames,"frames.aig",0,0,0);
    puts("Dumped unfolded frames into file \"frames.aig\".");
  }
  if (pPars->fUseOldCnf == 0) {
    pCVar17 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p->pFrames,pPars->nLutSize,1,0,0,pPars->fVerbose);
    iVar9 = extraout_EDX_00;
  }
  else {
    pAig = Gia_ManToAigSimple(p->pFrames);
    pCVar17 = Cnf_DeriveOther(pAig,1);
    Aig_ManStop(pAig);
    iVar9 = extraout_EDX;
  }
  p->pCnf = pCVar17;
  Vec_IntFillExtra(p->vId2Var,p->pFrames->nObjs,iVar9);
  if (0 < (int)uVar11) {
    uVar24 = 0;
    uVar12 = 0;
    do {
      iVar9 = pGia->vCos->nSize - pGia->nRegs;
      uVar1 = uVar12 + 1;
      iVar9 = Gia_ManBmcCheckOutputs(p->pFrames,iVar9 * uVar12,iVar9 * uVar1);
      local_84 = 0xfffffffe;
      if (iVar9 == 0) {
        iVar9 = pGia->vCos->nSize - pGia->nRegs;
        Gia_ManBmcAddCnfNew(p,iVar9 * uVar12,iVar9 * uVar1);
        iVar9 = pGia->vCos->nSize - pGia->nRegs;
        uVar24 = (ulong)(iVar9 * uVar12);
        local_84 = 0xfffffffe;
        if ((int)(iVar9 * uVar12) < (int)(iVar9 * uVar1)) {
          uVar24 = (ulong)(iVar9 * uVar12);
          local_84 = 0xfffffffe;
          do {
            pGVar15 = p->pFrames;
            iVar10 = pGVar15->vCos->nSize;
            if (iVar10 - pGVar15->nRegs <= (int)uVar24) {
              __assert_fail("v < Gia_ManPoNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
            }
            if (((int)(iVar9 * uVar12) < 0) || (iVar10 <= (int)uVar24)) {
LAB_0056db01:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar10 = pGVar15->vCos->pArray[uVar24];
            lVar19 = (long)iVar10;
            if ((lVar19 < 0) || (pGVar15->nObjs <= iVar10)) {
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            pGVar7 = pGVar15->pObjs;
            uVar22 = (uint)*(undefined8 *)(pGVar7 + lVar19);
            pGVar23 = (Gia_Obj_t *)
                      ((ulong)(uVar22 >> 0x1d & 1) ^
                      (ulong)(pGVar7 + lVar19 + -(ulong)(uVar22 & 0x1fffffff)));
            bVar8 = true;
            if (pGVar7 != pGVar23) {
              if (((ulong)pGVar23 ^ (ulong)pGVar7) == 1) {
                printf("Output %d is trivially SAT.\n",uVar24 & 0xffffffff);
              }
              else {
                if (pGVar15->nObjs <= iVar10) {
                  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
                }
                if (p->vId2Var->nSize <= iVar10) goto LAB_0056db01;
                iVar10 = p->vId2Var->pArray[lVar19];
                if (iVar10 < 0) {
                  __assert_fail("Var >= 0 && !(c >> 1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x12e,"int Abc_Var2Lit(int, int)");
                }
                Lit = iVar10 * 2;
                iVar10 = sat_solver_solve(p->pSat,&Lit,(lit *)&ts,(long)pPars->nConfLimit,0,0,0);
                if (iVar10 != -1) {
                  if (iVar10 == 1) {
                    local_84 = 0;
                  }
                  bVar8 = false;
                  local_84 = local_84 | -(uint)(iVar10 == 0);
                }
              }
            }
          } while ((bVar8) &&
                  (uVar24 = uVar24 + 1,
                  (int)uVar24 < (int)((pGia->vCos->nSize - pGia->nRegs) * uVar1)));
        }
        if (pPars->fVerbose != 0) {
          pGVar15 = p->pFrames;
          iVar9 = pGVar15->vCis->nSize;
          iVar10 = pGVar15->nRegs;
          iVar2 = pGVar15->vCos->nSize;
          iVar3 = pGVar15->nObjs;
          iVar4 = p->nSatVars;
          uVar22 = p->vInputs->nSize;
          uVar5 = p->vNodes->nSize;
          iVar13 = sat_solver_nclauses(p->pSat);
          iVar14 = sat_solver_nconflicts(p->pSat);
          dVar25 = Gia_ManMemory(p->pFrames);
          printf("%4d :  PI =%9d.  AIG =%9d.  Var =%8d.  In =%6d.  And =%9d.  Cla =%9d.  Conf =%9d.  Mem =%7.1f MB   "
                 ,dVar25 * 9.5367431640625e-07,(ulong)uVar12,(ulong)(uint)(iVar9 - iVar10),
                 (ulong)(uint)(~(iVar9 + iVar2) + iVar3),(ulong)(iVar4 - 1),(ulong)uVar22,
                 (ulong)uVar5,CONCAT44(extraout_var,iVar13),CONCAT44(extraout_var_00,iVar14));
          iVar10 = 3;
          iVar9 = clock_gettime(3,(timespec *)&ts);
          if (iVar9 < 0) {
            lVar19 = -1;
          }
          else {
            lVar19 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          lVar20 = p->clkStart;
          Abc_Print(iVar10,"%s =","Time");
          Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar19 - lVar20) / 1000000.0);
        }
      }
      if (local_84 != 0xfffffffe) {
        if (local_84 == 0xffffffff) {
          printf("SAT solver reached conflict/runtime limit in frame %d.\n",(ulong)uVar12);
          local_84 = 0xffffffff;
        }
        else {
          if (pGia->pCexSeq != (Abc_Cex_t *)0x0) {
            free(pGia->pCexSeq);
            pGia->pCexSeq = (Abc_Cex_t *)0x0;
          }
          pAVar18 = Gia_ManBmcCexGen(p,pGia,(int)uVar24);
          pGia->pCexSeq = pAVar18;
          printf("Output %d of miter \"%s\" was asserted in frame %d.  ",
                 (ulong)((pGia->nRegs - pGia->vCos->nSize) * uVar12 + (int)uVar24),pGia->pName,
                 (ulong)uVar12);
          iVar10 = 3;
          iVar9 = clock_gettime(3,(timespec *)&ts);
          if (iVar9 < 0) {
            lVar19 = -1;
          }
          else {
            lVar19 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          lVar20 = p->clkStart;
          Abc_Print(iVar10,"%s =","Time");
          Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar19 - lVar20) / 1000000.0);
        }
        goto LAB_0056dab4;
      }
      pPars->iFrame = uVar12;
      uVar12 = uVar1;
    } while (uVar1 != uVar11);
  }
  local_84 = 0xfffffffe;
LAB_0056dab4:
  uVar11 = 0xffffffff;
  if (local_84 != 0xfffffffe) {
    uVar11 = local_84;
  }
  Gia_ManStop(p->pFrames);
  Bmc_MnaFree(p);
  return uVar11;
}

Assistant:

int Gia_ManBmcPerformInt( Gia_Man_t * pGia, Bmc_AndPar_t * pPars )
{
    Bmc_Mna_t * p;
    Gia_Man_t * pTemp;
    int nFramesMax, f, i=0, Lit = 1, status, RetValue = -2;
    abctime clk = Abc_Clock();
    p = Bmc_MnaAlloc();
    sat_solver_set_runtime_limit( p->pSat, pPars->nTimeOut ? pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    p->pFrames = Gia_ManBmcUnroll( pGia, pPars->nFramesMax, pPars->nFramesAdd, pPars->fVeryVerbose, &p->vPiMap );
    nFramesMax = Gia_ManPoNum(p->pFrames) / Gia_ManPoNum(pGia);
    if ( pPars->fVerbose )
    {
        printf( "Unfolding for %d frames with first non-trivial PO %d.  ", nFramesMax, Gia_ManBmcFindFirst(p->pFrames) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    if ( pPars->fUseSynth )
    {
        p->pFrames = Gia_ManAigSyn2( pTemp = p->pFrames, 1, 0, 0, 0, 0, pPars->fVerbose, 0 );  Gia_ManStop( pTemp );
    }
    else if ( pPars->fVerbose )
        Gia_ManPrintStats( p->pFrames, NULL );
    if ( pPars->fDumpFrames )
    {
        Gia_AigerWrite( p->pFrames, "frames.aig", 0, 0, 0 );
        printf( "Dumped unfolded frames into file \"frames.aig\".\n" );
    }
    if ( pPars->fUseOldCnf )
        p->pCnf = Cnf_DeriveGia( p->pFrames );
    else
    {
//        p->pFrames = Jf_ManDeriveCnf( pTemp = p->pFrames, 1 );  Gia_ManStop( pTemp );
//        p->pCnf = (Cnf_Dat_t *)p->pFrames->pData; p->pFrames->pData = NULL;
        p->pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p->pFrames, pPars->nLutSize, 1, 0, 0, pPars->fVerbose );
    }
    Vec_IntFillExtra( p->vId2Var, Gia_ManObjNum(p->pFrames), 0 );
    // create clauses for constant node
//    sat_solver_addclause( p->pSat, &Lit, &Lit + 1 );
    for ( f = 0; f < nFramesMax; f++ )
    {
        if ( !Gia_ManBmcCheckOutputs( p->pFrames, f * Gia_ManPoNum(pGia), (f+1) * Gia_ManPoNum(pGia) ) )
        {
            // create another slice
            Gia_ManBmcAddCnfNew( p, f * Gia_ManPoNum(pGia), (f+1) * Gia_ManPoNum(pGia) );
            // try solving the outputs
            for ( i = f * Gia_ManPoNum(pGia); i < (f+1) * Gia_ManPoNum(pGia); i++ )
            {
                Gia_Obj_t * pObj = Gia_ManPo(p->pFrames, i);
                if ( Gia_ObjChild0(pObj) == Gia_ManConst0(p->pFrames) )
                    continue;
                if ( Gia_ObjChild0(pObj) == Gia_ManConst1(p->pFrames) )
                {
                    printf( "Output %d is trivially SAT.\n", i );
                    continue;
                }
                Lit = Abc_Var2Lit( Vec_IntEntry(p->vId2Var, Gia_ObjId(p->pFrames, pObj)), 0 );
                status = sat_solver_solve( p->pSat, &Lit, &Lit + 1, (ABC_INT64_T)pPars->nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
                if ( status == l_False ) // unsat
                    continue;
                if ( status == l_True )  // sat
                    RetValue = 0;
                if ( status == l_Undef ) // undecided
                    RetValue = -1;
                break;
            }
            // report statistics
            if ( pPars->fVerbose )
            {
                printf( "%4d :  PI =%9d.  AIG =%9d.  Var =%8d.  In =%6d.  And =%9d.  Cla =%9d.  Conf =%9d.  Mem =%7.1f MB   ", 
                    f, Gia_ManPiNum(p->pFrames), Gia_ManAndNum(p->pFrames), 
                    p->nSatVars-1, Vec_IntSize(p->vInputs), Vec_IntSize(p->vNodes), 
                    sat_solver_nclauses(p->pSat), sat_solver_nconflicts(p->pSat), Gia_ManMemory(p->pFrames)/(1<<20) );
                Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
            }
        }
        if ( RetValue != -2 )
        {
            if ( RetValue == -1 )
                printf( "SAT solver reached conflict/runtime limit in frame %d.\n", f );
            else
            {
                ABC_FREE( pGia->pCexSeq );
                pGia->pCexSeq = Gia_ManBmcCexGen( p, pGia, i );
                printf( "Output %d of miter \"%s\" was asserted in frame %d.  ", 
                    i - f * Gia_ManPoNum(pGia), Gia_ManName(pGia), f );
                Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
            }
            break;
        }
        pPars->iFrame = f;
    }
    if ( RetValue == -2 )
        RetValue = -1;
    // cleanup
    Gia_ManStop( p->pFrames );
    Bmc_MnaFree( p );
    return RetValue;
}